

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# slghpatexpress.cc
# Opt level: O0

bool __thiscall EquationOr::resolveOperandLeft(EquationOr *this,OperandResolve *state)

{
  uint uVar1;
  int4 local_28;
  int4 iStack_24;
  bool res;
  int4 cur_size;
  int4 cur_rightmost;
  OperandResolve *state_local;
  EquationOr *this_local;
  
  iStack_24 = -1;
  local_28 = -1;
  uVar1 = (*this->right->_vptr_PatternEquation[3])(this->right,state);
  if ((uVar1 & 1) == 0) {
    this_local._7_1_ = false;
  }
  else {
    if ((state->cur_rightmost != -1) && (state->size != -1)) {
      iStack_24 = state->cur_rightmost;
      local_28 = state->size;
    }
    uVar1 = (*this->left->_vptr_PatternEquation[3])(this->left,state);
    if ((uVar1 & 1) == 0) {
      this_local._7_1_ = false;
    }
    else {
      if ((state->cur_rightmost == -1) || (state->size == -1)) {
        state->cur_rightmost = iStack_24;
        state->size = local_28;
      }
      this_local._7_1_ = true;
    }
  }
  return this_local._7_1_;
}

Assistant:

bool EquationOr::resolveOperandLeft(OperandResolve &state) const

{
  int4 cur_rightmost = -1;	// Initially we don't know our rightmost
  int4 cur_size = -1;		//   or size traversed since rightmost
  bool res = right->resolveOperandLeft(state);
  if (!res) return false;
  if ((state.cur_rightmost != -1)&&(state.size != -1)) {
    cur_rightmost = state.cur_rightmost;
    cur_size = state.size;
  }
  res = left->resolveOperandLeft(state);
  if (!res) return false;
  if ((state.cur_rightmost == -1)||(state.size == -1)) {
    state.cur_rightmost = cur_rightmost;
    state.size = cur_size;
  }
  return true;
}